

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O3

void gl_RenderFrameModels
               (FSpriteModelFrame *smf,FState *curState,int curTics,PClass *ti,
               Matrix3x4 *normaltransform,int translation)

{
  FModel *pFVar1;
  uint uVar2;
  FSpriteModelFrame *pFVar3;
  _func_int **pp_Var4;
  ulong uVar5;
  int i;
  long lVar6;
  FTexture *pFVar7;
  FState *pFVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  
  dVar11 = 0.0;
  if (((gl_interpolate_model_frames.Value) && ((smf->flags & 0x10) == 0)) &&
     (pFVar8 = curState->NextState, pFVar8 != (FState *)0x0 && pFVar8 != curState)) {
    fVar9 = 0.0;
    if (((ConsoleState == c_up) && (fVar9 = 0.0, menuactive != MENU_On)) &&
       (((byte)level.flags2 & 0x20) == 0)) {
      uVar2 = I_MSTime();
      fVar9 = (float)uVar2 * 0.035 - (float)(int)((float)uVar2 * 0.035);
    }
    dVar10 = (double)((float)(curState->Tics - curTics) - fVar9) / (double)(int)curState->Tics;
    dVar11 = 0.0;
    if (0.0 <= dVar10) {
      if ((smf->flags & 8) != 0) {
        if ((curState->sprite == curState[-1].sprite) && (curState->Frame == curState[-1].Frame)) {
          dVar10 = dVar10 * 0.5 + 0.5;
        }
        if ((curState->sprite == pFVar8->sprite) && (curState->Frame == pFVar8->Frame)) {
          dVar10 = dVar10 * 0.5;
          pFVar8 = pFVar8->NextState;
        }
      }
      dVar11 = dVar10;
      if (dVar10 != 0.0) {
        pFVar3 = gl_FindModelFrame(ti,(uint)pFVar8->sprite,(uint)pFVar8->Frame,false);
        goto LAB_00494b88;
      }
    }
  }
  dVar10 = dVar11;
  pFVar3 = (FSpriteModelFrame *)0x0;
LAB_00494b88:
  lVar6 = 0;
  do {
    if ((long)smf->modelIDs[lVar6] != -1) {
      uVar2 = smf->skinIDs[lVar6].texnum;
      if ((long)(int)uVar2 < 1) {
        pFVar7 = (FTexture *)0x0;
      }
      else {
        pFVar7 = (FTexture *)0x0;
        if (uVar2 < TexMan.Textures.Count) {
          pFVar7 = TexMan.Textures.Array[TexMan.Translation.Array[(int)uVar2]].Texture;
        }
      }
      pFVar1 = Models.super_TArray<FModel_*,_FModel_*>.Array[smf->modelIDs[lVar6]];
      (*pFVar1->_vptr_FModel[5])(pFVar1);
      gl_RenderState.mVertexBuffer = &pFVar1->mVBuf->super_FVertexBuffer;
      pFVar1->curSpriteMDLFrame = smf;
      pFVar1->curMDLIndex = (int)lVar6;
      uVar2 = smf->modelframes[lVar6];
      if ((pFVar3 == (FSpriteModelFrame *)0x0) ||
         (uVar5 = (ulong)(uint)pFVar3->modelframes[lVar6], uVar2 == pFVar3->modelframes[lVar6])) {
        pp_Var4 = pFVar1->_vptr_FModel;
        uVar5 = (ulong)uVar2;
        dVar11 = 0.0;
      }
      else {
        pp_Var4 = pFVar1->_vptr_FModel;
        dVar11 = dVar10;
      }
      (*pp_Var4[4])(dVar11,pFVar1,pFVar7,(ulong)uVar2,uVar5,(ulong)(uint)translation);
      gl_RenderState.mVertexBuffer = &GLRenderer->mVBO->super_FVertexBuffer;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  return;
}

Assistant:

void gl_RenderFrameModels( const FSpriteModelFrame *smf,
						   const FState *curState,
						   const int curTics,
						   const PClass *ti,
						   Matrix3x4 *normaltransform,
						   int translation)
{
	// [BB] Frame interpolation: Find the FSpriteModelFrame smfNext which follows after smf in the animation
	// and the scalar value inter ( element of [0,1) ), both necessary to determine the interpolated frame.
	FSpriteModelFrame * smfNext = nullptr;
	double inter = 0.;
	if( gl_interpolate_model_frames && !(smf->flags & MDL_NOINTERPOLATION) )
	{
		FState *nextState = curState->GetNextState( );
		if( curState != nextState && nextState )
		{
			// [BB] To interpolate at more than 35 fps we take tic fractions into account.
			float ticFraction = 0.;
			// [BB] In case the tic counter is frozen we have to leave ticFraction at zero.
			if ( ConsoleState == c_up && menuactive != MENU_On && !(level.flags2 & LEVEL2_FROZEN) )
			{
				float time = GetTimeFloat();
				ticFraction = (time - static_cast<int>(time));
			}
			inter = static_cast<double>(curState->Tics - curTics - ticFraction)/static_cast<double>(curState->Tics);

			// [BB] For some actors (e.g. ZPoisonShroom) spr->actor->tics can be bigger than curState->Tics.
			// In this case inter is negative and we need to set it to zero.
			if ( inter < 0. )
				inter = 0.;
			else
			{
				// [BB] Workaround for actors that use the same frame twice in a row.
				// Most of the standard Doom monsters do this in their see state.
				if ( (smf->flags & MDL_INTERPOLATEDOUBLEDFRAMES) )
				{
					const FState *prevState = curState - 1;
					if ( (curState->sprite == prevState->sprite) && ( curState->Frame == prevState->Frame) )
					{
						inter /= 2.;
						inter += 0.5;
					}
					if ( (curState->sprite == nextState->sprite) && ( curState->Frame == nextState->Frame) )
					{
						inter /= 2.;
						nextState = nextState->GetNextState( );
					}
				}
				if ( inter != 0.0 )
					smfNext = gl_FindModelFrame(ti, nextState->sprite, nextState->Frame, false);
			}
		}
	}

	for(int i=0; i<MAX_MODELS_PER_FRAME; i++)
	{
		if (smf->modelIDs[i] != -1)
		{
			FModel * mdl = Models[smf->modelIDs[i]];
			FTexture *tex = smf->skinIDs[i].isValid()? TexMan(smf->skinIDs[i]) : nullptr;
			mdl->BuildVertexBuffer();
			gl_RenderState.SetVertexBuffer(mdl->mVBuf);

			mdl->PushSpriteMDLFrame(smf, i);

			if ( smfNext && smf->modelframes[i] != smfNext->modelframes[i] )
				mdl->RenderFrame(tex, smf->modelframes[i], smfNext->modelframes[i], inter, translation);
			else
				mdl->RenderFrame(tex, smf->modelframes[i], smf->modelframes[i], 0.f, translation);

			gl_RenderState.SetVertexBuffer(GLRenderer->mVBO);
		}
	}
}